

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

_Bool finalize_p2pkh(wally_psbt_input *input)

{
  wally_map_item *pwVar1;
  _Bool _Var2;
  int iVar3;
  wally_map_item *sig;
  size_t script_len;
  uchar script [140];
  wally_psbt_input *input_local;
  
  if ((input->signatures).num_items == 1) {
    pwVar1 = (input->signatures).items;
    unique0x100000cd = input;
    iVar3 = wally_scriptsig_p2pkh_from_der
                      (pwVar1->key,pwVar1->key_len,pwVar1->value,pwVar1->value_len,
                       (uchar *)&script_len,0x8c,(size_t *)&sig);
    if (iVar3 == 0) {
      _Var2 = clone_bytes(&stack0xffffffffffffffe8->final_scriptsig,(uchar *)&script_len,(size_t)sig
                         );
      if (_Var2) {
        stack0xffffffffffffffe8->final_scriptsig_len = (size_t)sig;
        input_local._7_1_ = true;
      }
      else {
        input_local._7_1_ = false;
      }
    }
    else {
      input_local._7_1_ = false;
    }
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

static bool finalize_p2pkh(struct wally_psbt_input *input)
{
    unsigned char script[WALLY_SCRIPTSIG_P2PKH_MAX_LEN];
    size_t script_len;
    const struct wally_map_item *sig;

    if (input->signatures.num_items != 1)
        return false; /* Must be single key, single sig */

    sig = &input->signatures.items[0];

    if (wally_scriptsig_p2pkh_from_der(sig->key, sig->key_len,
                                       sig->value, sig->value_len,
                                       script, sizeof(script),
                                       &script_len) != WALLY_OK)
        return false;

    if (!clone_bytes(&input->final_scriptsig, script, script_len))
        return false;
    input->final_scriptsig_len = script_len;
    return true;
}